

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

int socketSet(char *where,mpt_fdmode *mode,_func_int_varargs *operation)

{
  byte bVar1;
  uint uVar2;
  addrinfo *paVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  uint unaff_EBP;
  char *__service;
  char *__name;
  addrinfo *res;
  sockaddr_un addr;
  addrinfo *local_b0;
  addrinfo local_a8 [2];
  
  bVar1 = mode->family;
  if (bVar1 < 2) {
    if (bVar1 == 0) goto LAB_00103bd4;
    if (bVar1 != 1) goto LAB_00103c39;
    sVar8 = strlen(where);
    if (0x6b < sVar8) {
      piVar9 = __errno_location();
      *piVar9 = 0x22;
      goto LAB_00103de7;
    }
    unaff_EBP = socket(1,(uint)(mode->param).sock.type,(uint)(mode->param).sock.proto);
    if ((int)unaff_EBP < 0) {
      bVar4 = false;
      uVar7 = unaff_EBP;
      goto LAB_00103dee;
    }
    local_a8[0].ai_flags._0_2_ = 1;
    memcpy((void *)((long)&local_a8[0].ai_flags + 2),where,sVar8 + 1);
    iVar6 = (*operation)((ulong)unaff_EBP,local_a8,0x6e);
    if (iVar6 < 0) {
      close(unaff_EBP);
      bVar4 = false;
      uVar7 = 0xffffffff;
      goto LAB_00103dee;
    }
LAB_00103dc4:
    uVar7 = (uint)((mode->param).sock.type == '\x01') * 4 + 3;
    mode->stream = (uint16_t)uVar7;
    bVar4 = true;
  }
  else {
    if ((bVar1 != 2) && (bVar1 != 10)) {
LAB_00103c39:
      piVar9 = __errno_location();
      *piVar9 = 0x5d;
      return -4;
    }
LAB_00103bd4:
    if ((bVar1 == 2) || (*where != '[')) {
      pcVar10 = strrchr(where,0x3a);
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (char *)0x0;
        cVar5 = '\0';
        __service = (char *)0x0;
      }
      else {
        cVar5 = *pcVar10;
        *pcVar10 = '\0';
        __service = pcVar10 + 1;
      }
LAB_00103c56:
      local_a8[0].ai_canonname = (char *)0x0;
      local_a8[0].ai_next = (addrinfo *)0x0;
      local_a8[0].ai_addrlen = 0;
      local_a8[0]._20_4_ = 0;
      local_a8[0].ai_addr = (sockaddr *)0x0;
      local_a8[0]._0_8_ = (ulong)(uint)(int)mode->family << 0x20;
      local_a8[0].ai_protocol._0_1_ = (mode->param).sock.proto;
      local_a8[0].ai_socktype = (uint)(mode->param).sock.type;
      local_a8[0].ai_protocol._1_3_ = 0;
      __name = (char *)0x0;
      if (*where != '\0') {
        __name = where;
      }
      iVar6 = getaddrinfo(__name,__service,local_a8,&local_b0);
      if (cVar5 != '\0' && pcVar10 != (char *)0x0) {
        *pcVar10 = cVar5;
      }
      if (iVar6 == 0) {
        paVar3 = local_b0;
        while (unaff_EBP = 0xffffffff, paVar3 != (addrinfo *)0x0) {
          cVar5 = (char)paVar3->ai_family;
          mode->family = cVar5;
          uVar7 = paVar3->ai_socktype;
          (mode->param).sock.type = (uint8_t)uVar7;
          uVar2 = paVar3->ai_protocol;
          (mode->param).sock.proto = (uint8_t)uVar2;
          unaff_EBP = socket((int)cVar5,uVar7 & 0xff,uVar2 & 0xff);
          if (((int)unaff_EBP < 0) ||
             (iVar6 = (*operation)((ulong)unaff_EBP,paVar3->ai_addr,(ulong)paVar3->ai_addrlen),
             -1 < iVar6)) break;
          paVar3 = paVar3->ai_next;
          piVar9 = __errno_location();
          *piVar9 = 0x5c;
          close(unaff_EBP);
        }
        if (local_b0 != (addrinfo *)0x0) {
          freeaddrinfo(local_b0);
        }
        goto LAB_00103dc4;
      }
      if (iVar6 == -3) goto LAB_00103de7;
      if (iVar6 == -0xb) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = 0xfffffffd;
      }
    }
    else {
      where = where + 1;
      pcVar10 = strchr(where,0x5d);
      if (pcVar10 != (char *)0x0) {
        cVar5 = *pcVar10;
        *pcVar10 = '\0';
        __service = (char *)0x0;
        if (pcVar10[1] == ':') {
          __service = pcVar10 + 2;
        }
        goto LAB_00103c56;
      }
      piVar9 = __errno_location();
      *piVar9 = 0x5f;
LAB_00103de7:
      uVar7 = 0xfffffffe;
    }
    bVar4 = false;
  }
LAB_00103dee:
  if (bVar4) {
    uVar7 = unaff_EBP;
  }
  return uVar7;
}

Assistant:

static int socketSet(const char *where, MPT_STRUCT(fdmode) *mode, int (*operation)())
{
	int len, sock;
	
	/* unix socket */
	if (mode->family == AF_UNIX) {
		struct sockaddr_un addr;
		size_t len;
		
		if ((len = strlen(where)) >= sizeof(addr.sun_path)) {
			errno = ERANGE;
			return -2;
		}
		if ((sock = socket(AF_UNIX, mode->param.sock.type, mode->param.sock.proto)) < 0) {
			return sock;
		}
		addr.sun_family = AF_UNIX;
		memcpy(addr.sun_path, where, len+1);
		if (operation(sock, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
			(void) close(sock);
			return -1;
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	/* ip socket */
	else if (mode->family == AF_INET || mode->family == AF_INET6 || mode->family == AF_UNSPEC) {
		struct addrinfo hints, *res, *curr;
		char *port, *end, save = 0;
		
		if (mode->family != AF_INET && *where == '[') {
			if (!(end = strchr(++where, ']'))) {
				errno = ENOTSUP;
				return -2;
			}
			save = *end;
			*end = 0;
			port = (end[1] == ':') ? end+2 : 0;
		}
		else if ((end = port = strrchr(where, ':'))) {
			save = *end;
			*port++ = 0;
		}
		memset(&hints, 0, sizeof(hints));
		hints.ai_family   = mode->family;
		hints.ai_socktype = mode->param.sock.type;
		hints.ai_protocol = mode->param.sock.proto;
		
		if (!*where) {
			where = 0;
		}
		len = getaddrinfo(where, port, &hints, &res);
		
		if (end && save) {
			*end = save;
		}
		switch (len) {
		  case 0: break;
		  case EAI_AGAIN: return -2;
		  case EAI_SYSTEM: return -1;
		  default: return -3;
		}
		curr = res;
		sock = -1;
		
		while (curr) {
			mode->family           = curr->ai_family;
			mode->param.sock.type  = curr->ai_socktype;
			mode->param.sock.proto = curr->ai_protocol;
			
			if ((sock = socket(mode->family, mode->param.sock.type, mode->param.sock.proto)) < 0) {
				break;
			}
			if (operation(sock, curr->ai_addr, curr->ai_addrlen) >= 0) {
				break;
			}
			curr = curr->ai_next;
			
			errno = ENOPROTOOPT;
			(void) close(sock);
			sock = -1;
		}
		if (res) {
			freeaddrinfo(res);
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	else {
		errno = EPROTONOSUPPORT;
		return -4;
	}
	return sock;
}